

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O3

int comex_lock(int mutex,int proc)

{
  char *__ptr;
  char *message;
  
  __ptr = (char *)_my_malloc(1);
  *__ptr = '\x01';
  message = (char *)_my_malloc(0x28);
  message[0] = '\x11';
  message[1] = '\0';
  message[2] = '\0';
  message[3] = '\0';
  message[8] = '\0';
  message[9] = '\0';
  message[10] = '\0';
  message[0xb] = '\0';
  message[0xc] = '\0';
  message[0xd] = '\0';
  message[0xe] = '\0';
  message[0xf] = '\0';
  message[0x10] = '\0';
  message[0x11] = '\0';
  message[0x12] = '\0';
  message[0x13] = '\0';
  message[0x14] = '\0';
  message[0x15] = '\0';
  message[0x16] = '\0';
  message[0x17] = '\0';
  *(int *)(message + 0x18) = mutex;
  *(char **)(message + 0x20) = __ptr;
  _mq_push(proc,message,0x28);
  while (*__ptr != '\0') {
    comex_make_progress();
  }
  free(__ptr);
  return 0;
}

Assistant:

int comex_lock(int mutex, int proc)
{
    header_t *header = NULL;
    char *notify = NULL;

#if DEBUG
    printf("[%d] comex_lock id=%d proc=%d\n", l_state.rank, mutex, proc);
#endif

    notify = _my_malloc(sizeof(char));
    *notify = 1;

    header = _my_malloc(sizeof(header_t));
    header->operation = OP_LOCK_REQUEST;
    header->remote_address = NULL;
    header->local_address = NULL;
    header->length = mutex;
    header->notify_address = notify;

    _mq_push(proc, (char*)header, sizeof(header_t));

    while (*notify) {
#if DEBUG
        printf("notify=%d\n", (int)*notify);
#endif
        comex_make_progress();
    }

    _my_free(notify);

    return COMEX_SUCCESS;
}